

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UChar32 __thiscall icu_63::anon_unknown_16::UTF8NFDIterator::nextRawCodePoint(UTF8NFDIterator *this)

{
  byte bVar1;
  int iVar2;
  byte local_1d;
  uint local_1c;
  uint8_t __t;
  UChar32 c;
  UTF8NFDIterator *this_local;
  
  if ((this->pos == this->length) || ((this->s[this->pos] == '\0' && (this->length < 0)))) {
    return -1;
  }
  iVar2 = this->pos;
  this->pos = iVar2 + 1;
  local_1c = (uint)this->s[iVar2];
  if ((this->s[iVar2] & 0x80) == 0) {
    return local_1c;
  }
  if (this->pos == this->length) {
    return 0xfffd;
  }
  if (local_1c < 0xe0) {
    if (local_1c < 0xc2) {
      return 0xfffd;
    }
    local_1c = local_1c & 0x1f;
  }
  else {
    if (local_1c < 0xf0) {
      local_1c = local_1c & 0xf;
      if (((int)" 000000000000\x1000"[(int)local_1c] &
          1 << (sbyte)((int)(uint)this->s[this->pos] >> 5)) == 0) {
        return 0xfffd;
      }
      local_1d = this->s[this->pos] & 0x3f;
    }
    else {
      iVar2 = local_1c - 0xf0;
      if (4 < iVar2) {
        return 0xfffd;
      }
      if (((int)""[(int)(uint)this->s[this->pos] >> 4] & 1 << ((byte)iVar2 & 0x1f)) == 0) {
        return 0xfffd;
      }
      local_1c = iVar2 * 0x40 | this->s[this->pos] & 0x3f;
      iVar2 = this->pos + 1;
      this->pos = iVar2;
      if (iVar2 == this->length) {
        return 0xfffd;
      }
      local_1d = this->s[this->pos] + 0x80;
      if (0x3f < local_1d) {
        return 0xfffd;
      }
    }
    local_1c = local_1c << 6 | (uint)local_1d;
    iVar2 = this->pos + 1;
    this->pos = iVar2;
    if (iVar2 == this->length) {
      return 0xfffd;
    }
  }
  bVar1 = this->s[this->pos] + 0x80;
  if (0x3f < bVar1) {
    return 0xfffd;
  }
  this->pos = this->pos + 1;
  return local_1c << 6 | (uint)bVar1;
}

Assistant:

virtual UChar32 nextRawCodePoint() {
        if(pos == length || (s[pos] == 0 && length < 0)) { return U_SENTINEL; }
        UChar32 c;
        U8_NEXT_OR_FFFD(s, pos, length, c);
        return c;
    }